

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterBase.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterBase::SscWriterBase
          (SscWriterBase *this,IO *io,string *name,Mode mode,MPI_Comm comm)

{
  map *pmVar1;
  string *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int providedMpiMode;
  size_t in_stack_ffffffffffffff08;
  Buffer *in_stack_ffffffffffffff10;
  allocator *paVar2;
  int local_b0;
  allocator local_a9;
  MPI_Comm in_stack_ffffffffffffff58;
  SscWriterBase *in_stack_ffffffffffffff60;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [64];
  string *local_18;
  long local_10;
  
  *in_RDI = &PTR__SscWriterBase_0022a048;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Buffer::Buffer(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  in_RDI[10] = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)(in_RDI + 0xb),local_18);
  *(undefined4 *)(in_RDI + 0xf) = 0;
  *(undefined4 *)((long)in_RDI + 0x7c) = 10;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  in_RDI[0x11] = local_10;
  pmVar1 = (map *)(local_10 + 0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Verbose",&local_59);
  adios2::helper::GetParameter<int>(pmVar1,local_58,(int *)(in_RDI + 0xf));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pmVar1 = (map *)(local_10 + 0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Threading",&local_81);
  adios2::helper::GetParameter<bool>(pmVar1,local_80,(bool *)(in_RDI + 0x10));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pmVar1 = (map *)(local_10 + 0x60);
  paVar2 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff58,"OpenTimeoutSecs",paVar2);
  adios2::helper::GetParameter<int>
            (pmVar1,(string *)&stack0xffffffffffffff58,(int *)((long)in_RDI + 0x7c));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  MPI_Query_thread(&local_b0);
  if (((*(byte *)(in_RDI + 0x10) & 1) != 0) && (local_b0 != 3)) {
    *(undefined1 *)(in_RDI + 0x10) = 0;
  }
  SyncMpiPattern(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

SscWriterBase::SscWriterBase(IO &io, const std::string &name, const Mode mode, MPI_Comm comm)
: m_Name(name), m_IO(io)
{

    helper::GetParameter(io.m_Parameters, "Verbose", m_Verbosity);
    helper::GetParameter(io.m_Parameters, "Threading", m_Threading);
    helper::GetParameter(io.m_Parameters, "OpenTimeoutSecs", m_OpenTimeoutSecs);

    int providedMpiMode;
    MPI_Query_thread(&providedMpiMode);
    if (m_Threading && providedMpiMode != MPI_THREAD_MULTIPLE)
    {
        m_Threading = false;
    }

    SyncMpiPattern(comm);
}